

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

void dynamic_display(menu_conflict *m,int oid,_Bool cursor,int row,int col,int width)

{
  menu_row_validity_t row_valid_00;
  menu_row_style_t mVar1;
  menu_row_style_t style;
  menu_row_validity_t row_valid;
  uint8_t color;
  menu_entry *entry;
  int width_local;
  int col_local;
  int row_local;
  _Bool cursor_local;
  int oid_local;
  menu_conflict *m_local;
  
  style._3_1_ = curs_attrs[1][(int)(uint)cursor];
  if (m->row_funcs->valid_row != (_func_int_menu_ptr_int *)0x0) {
    row_valid_00 = (*m->row_funcs->valid_row)(m,oid);
    mVar1 = menu_row_style_for_validity(row_valid_00);
    style._3_1_ = curs_attrs[mVar1][(int)(uint)cursor];
  }
  _row_valid = (undefined8 *)menu_priv(m);
  row_local = oid;
  while( true ) {
    if (row_local == 0) {
      Term_putstr(col,row,width,(uint)(byte)style._3_1_,(char *)*_row_valid);
      return;
    }
    _row_valid = (undefined8 *)_row_valid[2];
    if (_row_valid == (undefined8 *)0x0) break;
    row_local = row_local + -1;
  }
  __assert_fail("entry",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                ,0x40e,"void dynamic_display(struct menu *, int, _Bool, int, int, int)");
}

Assistant:

static void dynamic_display(struct menu *m, int oid, bool cursor,
		int row, int col, int width)
{
	struct menu_entry *entry;
	uint8_t color = curs_attrs[MN_ROW_STYLE_ENABLED][0 != cursor];

	/* Hack? While row_funcs is private, we need to be consistent with what the menu will do. */
	if (m->row_funcs->valid_row) {
		menu_row_validity_t row_valid = m->row_funcs->valid_row(m, oid);
		menu_row_style_t style = menu_row_style_for_validity(row_valid);
		color = curs_attrs[style][0 != cursor];
	}

	for (entry = menu_priv(m); oid; oid--) {
		entry = entry->next;
		assert(entry);
	}

	Term_putstr(col, row, width, color, entry->text);
}